

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse42::SubGridIntersectorKPluecker<4,_4,_true>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  long lVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined8 *puVar7;
  float *pfVar8;
  undefined4 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  ushort uVar12;
  ushort uVar13;
  int iVar14;
  Geometry *pGVar15;
  long lVar16;
  RTCFilterFunctionN p_Var17;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  byte bVar21;
  byte bVar22;
  byte bVar23;
  byte bVar24;
  byte bVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  byte bVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [12];
  uint uVar33;
  int iVar34;
  uint uVar35;
  ulong uVar36;
  NodeRef *pNVar37;
  long lVar38;
  ulong uVar39;
  long lVar40;
  undefined4 uVar41;
  uint uVar42;
  ulong uVar43;
  long lVar44;
  ulong uVar45;
  long lVar46;
  ulong uVar47;
  NodeRef *pNVar48;
  ulong uVar49;
  ulong uVar50;
  uint uVar51;
  undefined1 auVar52 [8];
  ulong uVar53;
  size_t sVar54;
  ulong uVar55;
  byte bVar56;
  float fVar57;
  byte bVar76;
  byte bVar77;
  byte bVar79;
  float fVar80;
  byte bVar82;
  byte bVar83;
  undefined1 auVar58 [16];
  byte bVar78;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar81;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar110;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar111;
  float fVar112;
  float fVar119;
  float fVar121;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  float fVar120;
  float fVar122;
  float fVar123;
  undefined1 auVar118 [16];
  float fVar124;
  float fVar125;
  float fVar133;
  float fVar134;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar135;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  float fVar143;
  float fVar144;
  float fVar149;
  float fVar150;
  undefined1 auVar145 [16];
  float fVar151;
  float fVar152;
  float fVar153;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar154;
  float fVar158;
  float fVar159;
  float fVar160;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  undefined1 auVar164 [16];
  float fVar171;
  float fVar172;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  undefined1 auVar173 [16];
  float fVar182;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  float fVar183;
  float fVar184;
  float fVar187;
  float fVar188;
  float fVar189;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  UVIdentity<4> mapUV;
  float fStack_cf4;
  NodeRef *local_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  float fStack_c8c;
  undefined4 uStack_c6c;
  undefined1 local_c48 [16];
  undefined1 local_c38 [8];
  float fStack_c30;
  float fStack_c2c;
  float old_t;
  float fStack_c24;
  float fStack_c20;
  float fStack_c1c;
  undefined8 local_c18;
  undefined8 uStack_c10;
  float old_t_1;
  undefined4 uStack_c00;
  undefined4 uStack_bfc;
  undefined1 (*local_bf0) [16];
  RTCFilterFunctionNArguments args;
  float fStack_bb0;
  float fStack_bac;
  undefined1 local_ab8 [16];
  undefined1 local_aa8 [16];
  undefined1 local_a98 [16];
  undefined1 local_a88 [16];
  undefined1 local_a78 [16];
  undefined1 local_a68 [16];
  undefined1 local_a58 [16];
  float local_a48;
  float fStack_a44;
  float fStack_a40;
  float fStack_a3c;
  float local_a38;
  float fStack_a34;
  float fStack_a30;
  float fStack_a2c;
  float local_a28;
  float fStack_a24;
  float fStack_a20;
  float fStack_a1c;
  float local_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  float local_a08;
  float fStack_a04;
  float fStack_a00;
  float fStack_9fc;
  float local_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float local_9e8;
  float fStack_9e4;
  float fStack_9e0;
  float fStack_9dc;
  undefined1 local_9d8 [16];
  float local_9c8;
  float fStack_9c4;
  float fStack_9c0;
  float fStack_9bc;
  undefined1 local_9b8 [16];
  float local_9a8;
  float fStack_9a4;
  float fStack_9a0;
  float fStack_99c;
  undefined4 local_998;
  undefined4 uStack_994;
  undefined4 uStack_990;
  undefined4 uStack_98c;
  undefined1 local_988 [16];
  undefined4 local_978;
  undefined4 uStack_974;
  undefined4 uStack_970;
  undefined4 uStack_96c;
  undefined4 local_968;
  undefined4 uStack_964;
  undefined4 uStack_960;
  undefined4 uStack_95c;
  undefined1 local_958 [16];
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  uint local_928;
  uint uStack_924;
  uint uStack_920;
  uint uStack_91c;
  uint local_918;
  uint uStack_914;
  uint uStack_910;
  uint uStack_90c;
  float local_908;
  float fStack_904;
  float fStack_900;
  float fStack_8fc;
  float local_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float local_8e8;
  float fStack_8e4;
  float fStack_8e0;
  float fStack_8dc;
  undefined8 local_8d8;
  float fStack_8d0;
  float fStack_8cc;
  float local_8c8;
  float fStack_8c4;
  float fStack_8c0;
  float fStack_8bc;
  float local_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float local_8a8;
  float fStack_8a4;
  float fStack_8a0;
  float fStack_89c;
  float local_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float local_888;
  float fStack_884;
  float fStack_880;
  float fStack_87c;
  float local_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float local_868;
  float fStack_864;
  float fStack_860;
  float fStack_85c;
  float local_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float local_848;
  float fStack_844;
  float fStack_840;
  float fStack_83c;
  float local_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  undefined8 local_828;
  float fStack_820;
  float fStack_81c;
  float local_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  undefined1 local_808 [16];
  float local_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float local_7e8;
  float fStack_7e4;
  float fStack_7e0;
  float fStack_7dc;
  NodeRef stack [244];
  undefined1 auVar62 [16];
  
  stack[0] = root;
  fVar182 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar125 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar81 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar183 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar190 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar191 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_8c8 = fVar183 * 0.99999964;
  fVar124 = fVar190 * 0.99999964;
  fVar192 = fVar191 * 0.99999964;
  fVar183 = fVar183 * 1.0000004;
  fVar190 = fVar190 * 1.0000004;
  fVar191 = fVar191 * 1.0000004;
  uVar50 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar47 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  iVar14 = *(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar55 = (ulong)iVar14;
  iVar34 = (tray->tnear).field_0.i[k];
  auVar86._4_4_ = iVar34;
  auVar86._0_4_ = iVar34;
  auVar86._8_4_ = iVar34;
  auVar86._12_4_ = iVar34;
  iVar34 = (tray->tfar).field_0.i[k];
  auVar103._4_4_ = iVar34;
  auVar103._0_4_ = iVar34;
  auVar103._8_4_ = iVar34;
  auVar103._12_4_ = iVar34;
  uVar36 = (uVar55 ^ 0x10) >> 2;
  local_bf0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_858 = fVar182;
  fStack_854 = fVar182;
  fStack_850 = fVar182;
  fStack_84c = fVar182;
  local_868 = fVar125;
  fStack_864 = fVar125;
  fStack_860 = fVar125;
  fStack_85c = fVar125;
  local_878 = fVar81;
  fStack_874 = fVar81;
  fStack_870 = fVar81;
  fStack_86c = fVar81;
  local_888 = fVar183;
  fStack_884 = fVar183;
  fStack_880 = fVar183;
  fStack_87c = fVar183;
  local_898 = fVar190;
  fStack_894 = fVar190;
  fStack_890 = fVar190;
  fStack_88c = fVar190;
  local_8a8 = fVar191;
  fStack_8a4 = fVar191;
  fStack_8a0 = fVar191;
  fStack_89c = fVar191;
  local_8b8 = fVar192;
  fStack_8b4 = fVar192;
  fStack_8b0 = fVar192;
  fStack_8ac = fVar192;
  fStack_8c4 = local_8c8;
  fStack_8c0 = local_8c8;
  fStack_8bc = local_8c8;
  local_9c8 = fVar124;
  fStack_9c4 = fVar124;
  fStack_9c0 = fVar124;
  fStack_9bc = fVar124;
  local_9d8 = auVar86;
  local_9b8 = auVar103;
  local_cc0 = stack + 1;
  fVar135 = fVar182;
  fVar110 = fVar182;
  fVar161 = fVar182;
  fVar57 = fVar190;
  fVar80 = fVar190;
  fVar111 = fVar190;
  fVar119 = fVar191;
  fVar112 = fVar191;
  fVar120 = fVar191;
  fVar121 = fVar192;
  fVar122 = fVar192;
  fVar123 = fVar192;
  fVar133 = local_8c8;
  fVar134 = local_8c8;
  fVar143 = fVar124;
  fVar144 = fVar124;
  fVar149 = fVar124;
  fVar150 = fVar125;
  fVar151 = fVar125;
  fVar152 = fVar125;
  fVar153 = fVar81;
  fVar154 = fVar81;
  fVar158 = fVar81;
  fVar159 = fVar183;
  fVar160 = fVar183;
  fVar162 = fVar183;
LAB_00745240:
  do {
    pNVar48 = local_cc0;
    if (pNVar48 == stack) {
LAB_00746a98:
      return pNVar48 != stack;
    }
    pNVar37 = pNVar48 + -1;
    sVar54 = pNVar48[-1].ptr;
    local_cc0 = pNVar37;
    while ((sVar54 & 8) == 0) {
      pfVar8 = (float *)(sVar54 + 0x20 + uVar50);
      auVar58._0_4_ = (*pfVar8 - fVar182) * local_8c8;
      auVar58._4_4_ = (pfVar8[1] - fVar135) * fStack_8c4;
      auVar58._8_4_ = (pfVar8[2] - fVar110) * fVar133;
      auVar58._12_4_ = (pfVar8[3] - fVar161) * fVar134;
      pfVar8 = (float *)(sVar54 + 0x20 + uVar47);
      auVar101._0_4_ = (*pfVar8 - fVar125) * fVar124;
      auVar101._4_4_ = (pfVar8[1] - fVar150) * fVar143;
      auVar101._8_4_ = (pfVar8[2] - fVar151) * fVar144;
      auVar101._12_4_ = (pfVar8[3] - fVar152) * fVar149;
      auVar58 = maxps(auVar58,auVar101);
      pfVar8 = (float *)(sVar54 + 0x20 + uVar55);
      auVar137._0_4_ = (*pfVar8 - fVar81) * fVar192;
      auVar137._4_4_ = (pfVar8[1] - fVar153) * fVar121;
      auVar137._8_4_ = (pfVar8[2] - fVar154) * fVar122;
      auVar137._12_4_ = (pfVar8[3] - fVar158) * fVar123;
      pfVar8 = (float *)(sVar54 + 0x20 + (uVar50 ^ 0x10));
      auVar100._0_4_ = (*pfVar8 - fVar182) * fVar183;
      auVar100._4_4_ = (pfVar8[1] - fVar135) * fVar159;
      auVar100._8_4_ = (pfVar8[2] - fVar110) * fVar160;
      auVar100._12_4_ = (pfVar8[3] - fVar161) * fVar162;
      pfVar8 = (float *)(sVar54 + 0x20 + (uVar47 ^ 0x10));
      auVar113._0_4_ = (*pfVar8 - fVar125) * fVar190;
      auVar113._4_4_ = (pfVar8[1] - fVar150) * fVar57;
      auVar113._8_4_ = (pfVar8[2] - fVar151) * fVar80;
      auVar113._12_4_ = (pfVar8[3] - fVar152) * fVar111;
      auVar101 = minps(auVar100,auVar113);
      pfVar8 = (float *)(sVar54 + 0x20 + (uVar55 ^ 0x10));
      auVar114._0_4_ = (*pfVar8 - fVar81) * fVar191;
      auVar114._4_4_ = (pfVar8[1] - fVar153) * fVar119;
      auVar114._8_4_ = (pfVar8[2] - fVar154) * fVar112;
      auVar114._12_4_ = (pfVar8[3] - fVar158) * fVar120;
      auVar84 = maxps(auVar137,auVar86);
      auVar58 = maxps(auVar58,auVar84);
      auVar84 = minps(auVar114,auVar103);
      auVar101 = minps(auVar101,auVar84);
      auVar84._4_4_ = -(uint)(auVar58._4_4_ <= auVar101._4_4_);
      auVar84._0_4_ = -(uint)(auVar58._0_4_ <= auVar101._0_4_);
      auVar84._8_4_ = -(uint)(auVar58._8_4_ <= auVar101._8_4_);
      auVar84._12_4_ = -(uint)(auVar58._12_4_ <= auVar101._12_4_);
      uVar33 = movmskps((int)pNVar37,auVar84);
      if (uVar33 == 0) goto LAB_00745240;
      uVar33 = uVar33 & 0xff;
      pNVar37 = (NodeRef *)(sVar54 & 0xfffffffffffffff0);
      lVar46 = 0;
      if (uVar33 != 0) {
        for (; (uVar33 >> lVar46 & 1) == 0; lVar46 = lVar46 + 1) {
        }
      }
      sVar54 = pNVar37[lVar46].ptr;
      uVar33 = uVar33 - 1 & uVar33;
      uVar43 = (ulong)uVar33;
      if (uVar33 != 0) {
        do {
          local_cc0->ptr = sVar54;
          local_cc0 = local_cc0 + 1;
          lVar46 = 0;
          if (uVar43 != 0) {
            for (; (uVar43 >> lVar46 & 1) == 0; lVar46 = lVar46 + 1) {
            }
          }
          sVar54 = pNVar37[lVar46].ptr;
          uVar43 = uVar43 - 1 & uVar43;
        } while (uVar43 != 0);
      }
    }
    uVar43 = sVar54 & 0xfffffffffffffff0;
    for (lVar46 = 0; lVar46 != (ulong)((uint)sVar54 & 0xf) - 8; lVar46 = lVar46 + 1) {
      lVar38 = lVar46 * 0x58;
      lVar1 = uVar43 + lVar38;
      uVar10 = *(undefined8 *)(uVar43 + 0x20 + lVar38);
      uVar11 = *(undefined8 *)(uVar43 + 0x24 + lVar38);
      bVar18 = (byte)uVar10;
      bVar56 = (byte)uVar11;
      bVar19 = (byte)((ulong)uVar10 >> 8);
      bVar76 = (byte)((ulong)uVar11 >> 8);
      bVar20 = (byte)((ulong)uVar10 >> 0x10);
      bVar77 = (byte)((ulong)uVar11 >> 0x10);
      bVar21 = (byte)((ulong)uVar10 >> 0x18);
      bVar78 = (byte)((ulong)uVar11 >> 0x18);
      bVar22 = (byte)((ulong)uVar10 >> 0x20);
      bVar79 = (byte)((ulong)uVar11 >> 0x20);
      bVar23 = (byte)((ulong)uVar10 >> 0x28);
      bVar82 = (byte)((ulong)uVar11 >> 0x28);
      bVar24 = (byte)((ulong)uVar10 >> 0x30);
      bVar83 = (byte)((ulong)uVar11 >> 0x30);
      bVar30 = (byte)((ulong)uVar11 >> 0x38);
      bVar25 = (byte)((ulong)uVar10 >> 0x38);
      auVar59[0] = -((byte)((bVar18 < bVar56) * bVar18 | (bVar18 >= bVar56) * bVar56) == bVar18);
      auVar59[1] = -((byte)((bVar19 < bVar76) * bVar19 | (bVar19 >= bVar76) * bVar76) == bVar19);
      auVar59[2] = -((byte)((bVar20 < bVar77) * bVar20 | (bVar20 >= bVar77) * bVar77) == bVar20);
      auVar59[3] = -((byte)((bVar21 < bVar78) * bVar21 | (bVar21 >= bVar78) * bVar78) == bVar21);
      auVar59[4] = -((byte)((bVar22 < bVar79) * bVar22 | (bVar22 >= bVar79) * bVar79) == bVar22);
      auVar59[5] = -((byte)((bVar23 < bVar82) * bVar23 | (bVar23 >= bVar82) * bVar82) == bVar23);
      auVar59[6] = -((byte)((bVar24 < bVar83) * bVar24 | (bVar24 >= bVar83) * bVar83) == bVar24);
      auVar59[7] = -((byte)((bVar25 < bVar30) * bVar25 | (bVar25 >= bVar30) * bVar30) == bVar25);
      auVar59[8] = 0xff;
      auVar59[9] = 0xff;
      auVar59[10] = 0xff;
      auVar59[0xb] = 0xff;
      auVar59[0xc] = 0xff;
      auVar59[0xd] = 0xff;
      auVar59[0xe] = 0xff;
      auVar59[0xf] = 0xff;
      fVar143 = *(float *)(uVar43 + 0x38 + lVar38);
      fVar144 = *(float *)(uVar43 + 0x3c + lVar38);
      fVar149 = *(float *)(uVar43 + 0x44 + lVar38);
      auVar85._8_8_ = 0;
      auVar85._0_8_ = *(ulong *)((uVar50 >> 2) + 0x20 + lVar1);
      auVar86 = pmovzxbd(auVar85,auVar85);
      auVar102._8_8_ = 0;
      auVar102._0_8_ = *(ulong *)(((uVar50 ^ 0x10) >> 2) + 0x20 + lVar1);
      auVar103 = pmovzxbd(auVar102,auVar102);
      fVar124 = *(float *)(uVar43 + 0x48 + lVar38);
      auVar115._8_8_ = 0;
      auVar115._0_8_ = *(ulong *)((uVar47 >> 2) + 0x20 + lVar1);
      auVar58 = pmovzxbd(auVar115,auVar115);
      auVar116._8_8_ = 0;
      auVar116._0_8_ = *(ulong *)(((uVar47 ^ 0x10) >> 2) + 0x20 + lVar1);
      auVar84 = pmovzxbd(auVar116,auVar116);
      fVar163 = *(float *)(uVar43 + 0x4c + lVar38);
      auVar126._8_8_ = 0;
      auVar126._0_8_ = *(ulong *)((uVar55 >> 2) + 0x20 + lVar1);
      auVar101 = pmovzxbd(auVar126,auVar126);
      auVar136._8_8_ = 0;
      auVar136._0_8_ = *(ulong *)(uVar36 + 0x20 + lVar1);
      auVar137 = pmovzxbd(auVar136,auVar136);
      fVar165 = *(float *)(uVar43 + 0x40 + lVar38);
      auVar87._0_4_ = (((float)auVar86._0_4_ * fVar149 + fVar143) - fVar182) * local_8c8;
      auVar87._4_4_ = (((float)auVar86._4_4_ * fVar149 + fVar143) - fVar135) * fStack_8c4;
      auVar87._8_4_ = (((float)auVar86._8_4_ * fVar149 + fVar143) - fVar110) * fVar133;
      auVar87._12_4_ = (((float)auVar86._12_4_ * fVar149 + fVar143) - fVar161) * fVar134;
      auVar145._0_4_ = (((float)auVar58._0_4_ * fVar124 + fVar144) - fVar125) * local_9c8;
      auVar145._4_4_ = (((float)auVar58._4_4_ * fVar124 + fVar144) - fVar150) * fStack_9c4;
      auVar145._8_4_ = (((float)auVar58._8_4_ * fVar124 + fVar144) - fVar151) * fStack_9c0;
      auVar145._12_4_ = (((float)auVar58._12_4_ * fVar124 + fVar144) - fVar152) * fStack_9bc;
      auVar86 = maxps(auVar87,auVar145);
      auVar104._0_4_ = (((float)auVar103._0_4_ * fVar149 + fVar143) - fVar182) * fVar183;
      auVar104._4_4_ = (((float)auVar103._4_4_ * fVar149 + fVar143) - fVar135) * fVar159;
      auVar104._8_4_ = (((float)auVar103._8_4_ * fVar149 + fVar143) - fVar110) * fVar160;
      auVar104._12_4_ = (((float)auVar103._12_4_ * fVar149 + fVar143) - fVar161) * fVar162;
      auVar117._0_4_ = (((float)auVar84._0_4_ * fVar124 + fVar144) - fVar125) * fVar190;
      auVar117._4_4_ = (((float)auVar84._4_4_ * fVar124 + fVar144) - fVar150) * fVar57;
      auVar117._8_4_ = (((float)auVar84._8_4_ * fVar124 + fVar144) - fVar151) * fVar80;
      auVar117._12_4_ = (((float)auVar84._12_4_ * fVar124 + fVar144) - fVar152) * fVar111;
      auVar103 = minps(auVar104,auVar117);
      auVar127._0_4_ = (((float)auVar101._0_4_ * fVar163 + fVar165) - fVar81) * fVar192;
      auVar127._4_4_ = (((float)auVar101._4_4_ * fVar163 + fVar165) - fVar153) * fVar121;
      auVar127._8_4_ = (((float)auVar101._8_4_ * fVar163 + fVar165) - fVar154) * fVar122;
      auVar127._12_4_ = (((float)auVar101._12_4_ * fVar163 + fVar165) - fVar158) * fVar123;
      auVar58 = maxps(auVar127,local_9d8);
      auVar86 = maxps(auVar86,auVar58);
      auVar138._0_4_ = (((float)auVar137._0_4_ * fVar163 + fVar165) - fVar81) * fVar191;
      auVar138._4_4_ = (((float)auVar137._4_4_ * fVar163 + fVar165) - fVar153) * fVar119;
      auVar138._8_4_ = (((float)auVar137._8_4_ * fVar163 + fVar165) - fVar154) * fVar112;
      auVar138._12_4_ = (((float)auVar137._12_4_ * fVar163 + fVar165) - fVar158) * fVar120;
      auVar58 = minps(auVar138,local_9b8);
      auVar103 = minps(auVar103,auVar58);
      auVar60._4_4_ = -(uint)(auVar86._4_4_ <= auVar103._4_4_);
      auVar60._0_4_ = -(uint)(auVar86._0_4_ <= auVar103._0_4_);
      auVar60._8_4_ = -(uint)(auVar86._8_4_ <= auVar103._8_4_);
      auVar60._12_4_ = -(uint)(auVar86._12_4_ <= auVar103._12_4_);
      auVar86 = pmovzxbd(auVar59 ^ _DAT_01f46b70,auVar59 ^ _DAT_01f46b70);
      auVar60 = ~auVar86 & auVar60;
      auVar61._0_4_ = auVar60._0_4_ << 0x1f;
      auVar61._4_4_ = auVar60._4_4_ << 0x1f;
      auVar61._8_4_ = auVar60._8_4_ << 0x1f;
      auVar61._12_4_ = auVar60._12_4_ << 0x1f;
      uVar41 = movmskps((int)uVar36,auVar61);
      for (uVar45 = CONCAT44((uint)(iVar14 >> 0x1f) >> 2,uVar41); uVar45 != 0;
          uVar45 = uVar45 & uVar45 - 1) {
        lVar38 = 0;
        if (uVar45 != 0) {
          for (; (uVar45 >> lVar38 & 1) == 0; lVar38 = lVar38 + 1) {
          }
        }
        uVar12 = *(ushort *)(lVar1 + lVar38 * 8);
        uVar13 = *(ushort *)(lVar1 + 2 + lVar38 * 8);
        uVar33 = *(uint *)(lVar1 + 0x50);
        uVar35 = *(uint *)(lVar1 + 4 + lVar38 * 8);
        pGVar15 = (context->scene->geometries).items[uVar33].ptr;
        lVar38 = *(long *)&pGVar15->field_0x58;
        lVar16 = *(long *)&pGVar15[1].time_range.upper;
        _old_t_1 = (ulong)uVar35 *
                   pGVar15[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
        uVar51 = uVar12 & 0x7fff;
        uVar42 = *(uint *)(lVar38 + 4 + _old_t_1);
        uVar49 = (ulong)uVar42;
        uVar53 = (ulong)(uVar42 * (uVar13 & 0x7fff) + *(int *)(lVar38 + _old_t_1) + uVar51);
        p_Var17 = pGVar15[1].intersectionFilterN;
        pfVar8 = (float *)(lVar16 + (long)p_Var17 * uVar53);
        pfVar2 = (float *)(lVar16 + (uVar53 + 1) * (long)p_Var17);
        local_8e8 = pfVar2[1];
        fVar182 = pfVar2[2];
        pfVar3 = (float *)(lVar16 + (uVar53 + uVar49) * (long)p_Var17);
        fVar125 = *pfVar3;
        local_8f8 = pfVar3[1];
        local_cb8._0_4_ = pfVar3[2];
        lVar44 = uVar53 + uVar49 + 1;
        pfVar3 = (float *)(lVar16 + lVar44 * (long)p_Var17);
        fVar81 = *pfVar3;
        fVar183 = pfVar3[1];
        fVar190 = pfVar3[2];
        uVar39 = (ulong)(-1 < (short)uVar12);
        pfVar3 = (float *)(lVar16 + (uVar53 + uVar39 + 1) * (long)p_Var17);
        fVar191 = pfVar3[2];
        lVar40 = uVar39 + lVar44;
        uVar39 = 0;
        if (-1 < (short)uVar13) {
          uVar39 = uVar49;
        }
        pfVar4 = (float *)(lVar16 + lVar40 * (long)p_Var17);
        fStack_834 = pfVar4[1];
        fVar161 = pfVar4[2];
        pfVar5 = (float *)(lVar16 + (uVar53 + uVar49 + uVar39) * (long)p_Var17);
        pfVar6 = (float *)(lVar16 + (lVar44 + uVar39) * (long)p_Var17);
        local_848 = *pfVar6;
        fStack_844 = pfVar6[1];
        fStack_840 = pfVar6[2];
        local_838 = *pfVar4;
        fStack_830 = fVar161;
        fStack_82c = pfVar4[3];
        fStack_83c = pfVar6[3];
        fVar135 = *(float *)(ray + k * 4);
        local_9f8 = *(float *)(ray + k * 4 + 0x10);
        local_7e8 = *pfVar8 - fVar135;
        fStack_7e4 = *pfVar2 - fVar135;
        fStack_7e0 = fVar81 - fVar135;
        fStack_7dc = fVar125 - fVar135;
        fVar111 = *pfVar2 - fVar135;
        fVar119 = *pfVar3 - fVar135;
        fVar192 = *pfVar4 - fVar135;
        fVar122 = fVar81 - fVar135;
        local_828 = CONCAT44(fVar81,fVar125);
        local_818 = local_848;
        fStack_814 = *pfVar5;
        fVar125 = fVar125 - fVar135;
        fVar133 = fVar81 - fVar135;
        fVar134 = local_848 - fVar135;
        fVar135 = *pfVar5 - fVar135;
        local_a08 = *(float *)(ray + k * 4 + 0x20);
        local_c38._0_4_ = pfVar8[1] - local_9f8;
        local_c38._4_4_ = local_8e8 - local_9f8;
        fStack_c30 = fVar183 - local_9f8;
        fStack_c2c = local_8f8 - local_9f8;
        fVar171 = pfVar8[2] - local_a08;
        fVar176 = fVar182 - local_a08;
        fVar178 = fVar190 - local_a08;
        fVar180 = (float)local_cb8 - local_a08;
        fStack_8f4 = fVar183;
        fStack_8f0 = fStack_844;
        fStack_8ec = pfVar5[1];
        local_9e8 = local_8f8 - local_9f8;
        fStack_9e4 = fVar183 - local_9f8;
        fStack_9e0 = fStack_844 - local_9f8;
        fStack_9dc = pfVar5[1] - local_9f8;
        local_8d8 = CONCAT44(fVar190,(float)local_cb8);
        local_8c8 = fStack_840;
        fStack_8c4 = pfVar5[2];
        local_cb8._0_4_ = (float)local_cb8 - local_a08;
        local_cb8._4_4_ = fVar190 - local_a08;
        uStack_cb0._0_4_ = fStack_840 - local_a08;
        uStack_cb0._4_4_ = pfVar5[2] - local_a08;
        fVar143 = fVar125 - local_7e8;
        fVar149 = fVar133 - fStack_7e4;
        fVar150 = fVar134 - fStack_7e0;
        fVar152 = fVar135 - fStack_7dc;
        fVar184 = local_9e8 - (float)local_c38._0_4_;
        fVar187 = fStack_9e4 - (float)local_c38._4_4_;
        fVar188 = fStack_9e0 - fStack_c30;
        fVar189 = fStack_9dc - fStack_c2c;
        fVar162 = (float)local_cb8 - fVar171;
        fVar165 = local_cb8._4_4_ - fVar176;
        fVar167 = (float)uStack_cb0 - fVar178;
        fVar169 = uStack_cb0._4_4_ - fVar180;
        fVar110 = *(float *)(ray + k * 4 + 0x50);
        fStack_cf4 = *(float *)(ray + k * 4 + 0x60);
        fStack_c8c = *(float *)(ray + k * 4 + 0x40);
        fVar57 = (fVar184 * ((float)local_cb8 + fVar171) -
                 (local_9e8 + (float)local_c38._0_4_) * fVar162) * fStack_c8c +
                 ((fVar125 + local_7e8) * fVar162 - ((float)local_cb8 + fVar171) * fVar143) *
                 fVar110 + (fVar143 * (local_9e8 + (float)local_c38._0_4_) -
                           (fVar125 + local_7e8) * fVar184) * fStack_cf4;
        fVar80 = (fVar187 * (local_cb8._4_4_ + fVar176) -
                 (fStack_9e4 + (float)local_c38._4_4_) * fVar165) * fStack_c8c +
                 ((fVar133 + fStack_7e4) * fVar165 - (local_cb8._4_4_ + fVar176) * fVar149) *
                 fVar110 + (fVar149 * (fStack_9e4 + (float)local_c38._4_4_) -
                           (fVar133 + fStack_7e4) * fVar187) * fStack_cf4;
        auVar62._0_8_ = CONCAT44(fVar80,fVar57);
        auVar62._8_4_ =
             (fVar188 * ((float)uStack_cb0 + fVar178) - (fStack_9e0 + fStack_c30) * fVar167) *
             fStack_c8c +
             ((fVar134 + fStack_7e0) * fVar167 - ((float)uStack_cb0 + fVar178) * fVar150) * fVar110
             + (fVar150 * (fStack_9e0 + fStack_c30) - (fVar134 + fStack_7e0) * fVar188) * fStack_cf4
        ;
        auVar62._12_4_ =
             (fVar189 * (uStack_cb0._4_4_ + fVar180) - (fStack_9dc + fStack_c2c) * fVar169) *
             fStack_c8c +
             ((fVar135 + fStack_7dc) * fVar169 - (uStack_cb0._4_4_ + fVar180) * fVar152) * fVar110 +
             (fVar152 * (fStack_9dc + fStack_c2c) - (fVar135 + fStack_7dc) * fVar189) * fStack_cf4;
        fStack_8e4 = pfVar3[1];
        fStack_8e0 = fStack_834;
        fStack_8dc = fVar183;
        fStack_9f4 = local_9f8;
        fStack_9f0 = local_9f8;
        fStack_9ec = local_9f8;
        local_a48 = local_8e8 - local_9f8;
        fStack_a44 = pfVar3[1] - local_9f8;
        fStack_a40 = fStack_834 - local_9f8;
        fStack_a3c = fVar183 - local_9f8;
        fStack_a04 = local_a08;
        fStack_a00 = local_a08;
        fStack_9fc = local_a08;
        local_a38 = fVar182 - local_a08;
        fStack_a34 = fVar191 - local_a08;
        fStack_a30 = fStack_bb0 - local_a08;
        fStack_a2c = fStack_bac - local_a08;
        fVar163 = local_7e8 - fVar111;
        fVar166 = fStack_7e4 - fVar119;
        fVar168 = fStack_7e0 - fVar192;
        fVar170 = fStack_7dc - fVar122;
        fVar154 = (float)local_c38._0_4_ - local_a48;
        fVar158 = (float)local_c38._4_4_ - fStack_a44;
        fVar159 = fStack_c30 - fStack_a40;
        fVar160 = fStack_c2c - fStack_a3c;
        local_7f8 = fVar171 - local_a38;
        fStack_7f4 = fVar176 - fStack_a34;
        fStack_7f0 = fVar178 - fStack_a30;
        fStack_7ec = fVar180 - fStack_a2c;
        fVar193 = (fVar154 * (fVar171 + local_a38) -
                  ((float)local_c38._0_4_ + local_a48) * local_7f8) * fStack_c8c +
                  ((local_7e8 + fVar111) * local_7f8 - (fVar171 + local_a38) * fVar163) * fVar110 +
                  (fVar163 * ((float)local_c38._0_4_ + local_a48) - (local_7e8 + fVar111) * fVar154)
                  * fStack_cf4;
        fVar194 = (fVar158 * (fVar176 + fStack_a34) -
                  ((float)local_c38._4_4_ + fStack_a44) * fStack_7f4) * fStack_c8c +
                  ((fStack_7e4 + fVar119) * fStack_7f4 - (fVar176 + fStack_a34) * fVar166) * fVar110
                  + (fVar166 * ((float)local_c38._4_4_ + fStack_a44) -
                    (fStack_7e4 + fVar119) * fVar158) * fStack_cf4;
        fVar195 = (fVar159 * (fVar178 + fStack_a30) - (fStack_c30 + fStack_a40) * fStack_7f0) *
                  fStack_c8c +
                  ((fStack_7e0 + fVar192) * fStack_7f0 - (fVar178 + fStack_a30) * fVar168) * fVar110
                  + (fVar168 * (fStack_c30 + fStack_a40) - (fStack_7e0 + fVar192) * fVar159) *
                    fStack_cf4;
        fVar196 = (fVar160 * (fVar180 + fStack_a2c) - (fStack_c2c + fStack_a3c) * fStack_7ec) *
                  fStack_c8c +
                  ((fStack_7dc + fVar122) * fStack_7ec - (fVar180 + fStack_a2c) * fVar170) * fVar110
                  + (fVar170 * (fStack_c2c + fStack_a3c) - (fStack_7dc + fVar122) * fVar160) *
                    fStack_cf4;
        fVar172 = fVar111 - fVar125;
        fVar177 = fVar119 - fVar133;
        fVar179 = fVar192 - fVar134;
        fVar181 = fVar122 - fVar135;
        fVar144 = local_a48 - local_9e8;
        fVar124 = fStack_a44 - fStack_9e4;
        fVar151 = fStack_a40 - fStack_9e0;
        fVar153 = fStack_a3c - fStack_9dc;
        fVar112 = local_a38 - (float)local_cb8;
        fVar120 = fStack_a34 - local_cb8._4_4_;
        fVar121 = fStack_a30 - (float)uStack_cb0;
        fVar123 = fStack_a2c - uStack_cb0._4_4_;
        local_a28 = local_a48 + local_9e8;
        fStack_a24 = fStack_a44 + fStack_9e4;
        fStack_a20 = fStack_a40 + fStack_9e0;
        fStack_a1c = fStack_a3c + fStack_9dc;
        local_a18 = local_a38 + (float)local_cb8;
        fStack_a14 = fStack_a34 + local_cb8._4_4_;
        fStack_a10 = fStack_a30 + (float)uStack_cb0;
        fStack_a0c = fStack_a2c + uStack_cb0._4_4_;
        auVar88._0_4_ =
             (fVar144 * local_a18 - local_a28 * fVar112) * fStack_c8c +
             ((fVar125 + fVar111) * fVar112 - fVar172 * local_a18) * fVar110 +
             (fVar172 * local_a28 - (fVar125 + fVar111) * fVar144) * fStack_cf4;
        auVar88._4_4_ =
             (fVar124 * fStack_a14 - fStack_a24 * fVar120) * fStack_c8c +
             ((fVar133 + fVar119) * fVar120 - fVar177 * fStack_a14) * fVar110 +
             (fVar177 * fStack_a24 - (fVar133 + fVar119) * fVar124) * fStack_cf4;
        auVar88._8_4_ =
             (fVar151 * fStack_a10 - fStack_a20 * fVar121) * fStack_c8c +
             ((fVar134 + fVar192) * fVar121 - fVar179 * fStack_a10) * fVar110 +
             (fVar179 * fStack_a20 - (fVar134 + fVar192) * fVar151) * fStack_cf4;
        auVar88._12_4_ =
             (fVar153 * fStack_a0c - fStack_a1c * fVar123) * fStack_c8c +
             ((fVar135 + fVar122) * fVar123 - fVar181 * fStack_a0c) * fVar110 +
             (fVar181 * fStack_a1c - (fVar135 + fVar122) * fVar153) * fStack_cf4;
        local_9a8 = fVar57 + fVar193 + auVar88._0_4_;
        fStack_9a4 = fVar80 + fVar194 + auVar88._4_4_;
        fStack_9a0 = auVar62._8_4_ + fVar195 + auVar88._8_4_;
        fStack_99c = auVar62._12_4_ + fVar196 + auVar88._12_4_;
        auVar27._4_4_ = fVar194;
        auVar27._0_4_ = fVar193;
        auVar27._8_4_ = fVar195;
        auVar27._12_4_ = fVar196;
        auVar86 = minps(auVar62,auVar27);
        auVar86 = minps(auVar86,auVar88);
        local_808._8_4_ = auVar62._8_4_;
        local_808._0_8_ = auVar62._0_8_;
        local_808._12_4_ = auVar62._12_4_;
        auVar139._8_4_ = auVar62._8_4_;
        auVar139._0_8_ = auVar62._0_8_;
        auVar139._12_4_ = auVar62._12_4_;
        auVar28._4_4_ = fVar194;
        auVar28._0_4_ = fVar193;
        auVar28._8_4_ = fVar195;
        auVar28._12_4_ = fVar196;
        auVar103 = maxps(auVar139,auVar28);
        auVar103 = maxps(auVar103,auVar88);
        fVar125 = ABS(local_9a8);
        fVar135 = ABS(fStack_9a4);
        fVar111 = ABS(fStack_9a0);
        fVar119 = ABS(fStack_99c);
        auVar140._4_4_ = -(uint)(auVar103._4_4_ <= fVar135 * 1.1920929e-07);
        auVar140._0_4_ = -(uint)(auVar103._0_4_ <= fVar125 * 1.1920929e-07);
        auVar140._8_4_ = -(uint)(auVar103._8_4_ <= fVar111 * 1.1920929e-07);
        auVar140._12_4_ = -(uint)(auVar103._12_4_ <= fVar119 * 1.1920929e-07);
        auVar63._4_4_ = -(uint)(-(fVar135 * 1.1920929e-07) <= auVar86._4_4_);
        auVar63._0_4_ = -(uint)(-(fVar125 * 1.1920929e-07) <= auVar86._0_4_);
        auVar63._8_4_ = -(uint)(-(fVar111 * 1.1920929e-07) <= auVar86._8_4_);
        auVar63._12_4_ = -(uint)(-(fVar119 * 1.1920929e-07) <= auVar86._12_4_);
        auVar140 = auVar140 | auVar63;
        lVar40 = (uVar39 + lVar40) * (long)p_Var17;
        iVar34 = movmskps((int)lVar40,auVar140);
        puVar7 = (undefined8 *)(lVar16 + lVar40);
        local_c18 = *puVar7;
        uStack_c10 = puVar7[1];
        local_a58 = ZEXT416(uVar35);
        uVar41 = SUB84(ray,0);
        if (iVar34 != 0) {
          local_908 = fVar125;
          fStack_904 = fVar135;
          fStack_900 = fVar111;
          fStack_8fc = fVar119;
          auVar155._0_4_ = fVar154 * fVar112 - fVar144 * local_7f8;
          auVar155._4_4_ = fVar158 * fVar120 - fVar124 * fStack_7f4;
          auVar155._8_4_ = fVar159 * fVar121 - fVar151 * fStack_7f0;
          auVar155._12_4_ = fVar160 * fVar123 - fVar153 * fStack_7ec;
          auVar64._4_4_ = -(uint)(ABS(fVar158 * fVar165) < ABS(fVar124 * fStack_7f4));
          auVar64._0_4_ = -(uint)(ABS(fVar154 * fVar162) < ABS(fVar144 * local_7f8));
          auVar64._8_4_ = -(uint)(ABS(fVar159 * fVar167) < ABS(fVar151 * fStack_7f0));
          auVar64._12_4_ = -(uint)(ABS(fVar160 * fVar169) < ABS(fVar153 * fStack_7ec));
          auVar26._4_4_ = fVar187 * fStack_7f4 - fVar158 * fVar165;
          auVar26._0_4_ = fVar184 * local_7f8 - fVar154 * fVar162;
          auVar26._8_4_ = fVar188 * fStack_7f0 - fVar159 * fVar167;
          auVar26._12_4_ = fVar189 * fStack_7ec - fVar160 * fVar169;
          local_a88 = blendvps(auVar155,auVar26,auVar64);
          auVar185._0_4_ = fVar162 * fVar163 - fVar143 * local_7f8;
          auVar185._4_4_ = fVar165 * fVar166 - fVar149 * fStack_7f4;
          auVar185._8_4_ = fVar167 * fVar168 - fVar150 * fStack_7f0;
          auVar185._12_4_ = fVar169 * fVar170 - fVar152 * fStack_7ec;
          auVar173._0_4_ = fVar172 * local_7f8 - fVar163 * fVar112;
          auVar173._4_4_ = fVar177 * fStack_7f4 - fVar166 * fVar120;
          auVar173._8_4_ = fVar179 * fStack_7f0 - fVar168 * fVar121;
          auVar173._12_4_ = fVar181 * fStack_7ec - fVar170 * fVar123;
          auVar65._4_4_ = -(uint)(ABS(fVar149 * fStack_7f4) < ABS(fVar166 * fVar120));
          auVar65._0_4_ = -(uint)(ABS(fVar143 * local_7f8) < ABS(fVar163 * fVar112));
          auVar65._8_4_ = -(uint)(ABS(fVar150 * fStack_7f0) < ABS(fVar168 * fVar121));
          auVar65._12_4_ = -(uint)(ABS(fVar152 * fStack_7ec) < ABS(fVar170 * fVar123));
          local_a78 = blendvps(auVar173,auVar185,auVar65);
          auVar128._0_4_ = fVar143 * fVar154 - fVar163 * fVar184;
          auVar128._4_4_ = fVar149 * fVar158 - fVar166 * fVar187;
          auVar128._8_4_ = fVar150 * fVar159 - fVar168 * fVar188;
          auVar128._12_4_ = fVar152 * fVar160 - fVar170 * fVar189;
          auVar164._0_4_ = fVar163 * fVar144 - fVar172 * fVar154;
          auVar164._4_4_ = fVar166 * fVar124 - fVar177 * fVar158;
          auVar164._8_4_ = fVar168 * fVar151 - fVar179 * fVar159;
          auVar164._12_4_ = fVar170 * fVar153 - fVar181 * fVar160;
          auVar66._4_4_ = -(uint)(ABS(fVar166 * fVar187) < ABS(fVar177 * fVar158));
          auVar66._0_4_ = -(uint)(ABS(fVar163 * fVar184) < ABS(fVar172 * fVar154));
          auVar66._8_4_ = -(uint)(ABS(fVar168 * fVar188) < ABS(fVar179 * fVar159));
          auVar66._12_4_ = -(uint)(ABS(fVar170 * fVar189) < ABS(fVar181 * fVar160));
          local_a68 = blendvps(auVar164,auVar128,auVar66);
          fVar112 = fStack_c8c * local_a88._0_4_ +
                    fVar110 * local_a78._0_4_ + fStack_cf4 * local_a68._0_4_;
          fVar120 = fStack_c8c * local_a88._4_4_ +
                    fVar110 * local_a78._4_4_ + fStack_cf4 * local_a68._4_4_;
          fVar192 = fStack_c8c * local_a88._8_4_ +
                    fVar110 * local_a78._8_4_ + fStack_cf4 * local_a68._8_4_;
          fVar121 = fStack_c8c * local_a88._12_4_ +
                    fVar110 * local_a78._12_4_ + fStack_cf4 * local_a68._12_4_;
          auVar67._0_4_ = fVar112 + fVar112;
          auVar67._4_4_ = fVar120 + fVar120;
          auVar67._8_4_ = fVar192 + fVar192;
          auVar67._12_4_ = fVar121 + fVar121;
          auVar105._0_4_ = (float)local_c38._0_4_ * local_a78._0_4_ + fVar171 * local_a68._0_4_;
          auVar105._4_4_ = (float)local_c38._4_4_ * local_a78._4_4_ + fVar176 * local_a68._4_4_;
          auVar105._8_4_ = fStack_c30 * local_a78._8_4_ + fVar178 * local_a68._8_4_;
          auVar105._12_4_ = fStack_c2c * local_a78._12_4_ + fVar180 * local_a68._12_4_;
          fVar122 = local_7e8 * local_a88._0_4_ + auVar105._0_4_;
          fVar123 = fStack_7e4 * local_a88._4_4_ + auVar105._4_4_;
          fVar133 = fStack_7e0 * local_a88._8_4_ + auVar105._8_4_;
          fVar134 = fStack_7dc * local_a88._12_4_ + auVar105._12_4_;
          auVar86 = rcpps(auVar105,auVar67);
          fVar112 = auVar86._0_4_;
          fVar120 = auVar86._4_4_;
          fVar192 = auVar86._8_4_;
          fVar121 = auVar86._12_4_;
          local_a98._0_4_ =
               ((1.0 - auVar67._0_4_ * fVar112) * fVar112 + fVar112) * (fVar122 + fVar122);
          local_a98._4_4_ =
               ((1.0 - auVar67._4_4_ * fVar120) * fVar120 + fVar120) * (fVar123 + fVar123);
          local_a98._8_4_ =
               ((1.0 - auVar67._8_4_ * fVar192) * fVar192 + fVar192) * (fVar133 + fVar133);
          local_a98._12_4_ =
               ((1.0 - auVar67._12_4_ * fVar121) * fVar121 + fVar121) * (fVar134 + fVar134);
          fVar112 = *(float *)(ray + k * 4 + 0x80);
          _old_t = ZEXT416((uint)fVar112);
          fVar120 = *(float *)(ray + k * 4 + 0x30);
          auVar106._0_4_ =
               -(uint)(local_a98._0_4_ <= fVar112 && fVar120 <= local_a98._0_4_) & auVar140._0_4_;
          auVar106._4_4_ =
               -(uint)(local_a98._4_4_ <= fVar112 && fVar120 <= local_a98._4_4_) & auVar140._4_4_;
          auVar106._8_4_ =
               -(uint)(local_a98._8_4_ <= fVar112 && fVar120 <= local_a98._8_4_) & auVar140._8_4_;
          auVar106._12_4_ =
               -(uint)(local_a98._12_4_ <= fVar112 && fVar120 <= local_a98._12_4_) & auVar140._12_4_
          ;
          iVar34 = movmskps(uVar41,auVar106);
          if ((iVar34 == 0) ||
             (auVar107._0_4_ = auVar106._0_4_ & -(uint)(auVar67._0_4_ != 0.0),
             auVar107._4_4_ = auVar106._4_4_ & -(uint)(auVar67._4_4_ != 0.0),
             auVar107._8_4_ = auVar106._8_4_ & -(uint)(auVar67._8_4_ != 0.0),
             auVar107._12_4_ = auVar106._12_4_ & -(uint)(auVar67._12_4_ != 0.0),
             uVar42 = movmskps((int)k,auVar107), uVar42 == 0)) goto LAB_00746149;
          auVar89._4_12_ = local_a98._4_12_;
          auVar89._0_4_ = (float)(int)(*(ushort *)(lVar38 + 8 + _old_t_1) - 1);
          auVar129._4_4_ = local_a98._4_4_;
          auVar129._0_4_ = auVar89._0_4_;
          auVar129._8_4_ = local_a98._8_4_;
          auVar129._12_4_ = local_a98._12_4_;
          auVar86 = rcpss(auVar129,auVar89);
          auVar141._4_12_ = auVar140._4_12_;
          auVar141._0_4_ = (float)(int)(*(ushort *)(lVar38 + 10 + _old_t_1) - 1);
          fVar112 = (2.0 - auVar89._0_4_ * auVar86._0_4_) * auVar86._0_4_;
          auVar130._4_4_ = auVar140._4_4_;
          auVar130._0_4_ = auVar141._0_4_;
          auVar130._8_4_ = auVar140._8_4_;
          auVar130._12_4_ = auVar140._12_4_;
          auVar86 = rcpss(auVar130,auVar141);
          fVar120 = (2.0 - auVar141._0_4_ * auVar86._0_4_) * auVar86._0_4_;
          auVar108._0_4_ = (float)(int)fVar161 * local_9a8 + fVar193;
          auVar108._4_4_ = (float)(int)fVar161 * fStack_9a4 + fVar194;
          auVar108._8_4_ = (float)((int)fVar161 + 1) * fStack_9a0 + fVar195;
          auVar108._12_4_ = (float)((int)fVar161 + 1) * fStack_99c + fVar196;
          auVar52 = (undefined1  [8])(context->scene->geometries).items[uVar33].ptr;
          if ((((Geometry *)auVar52)->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) goto LAB_00746149;
          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
             (((Geometry *)auVar52)->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            auVar31._4_4_ = fStack_9a4;
            auVar31._0_4_ = local_9a8;
            auVar31._8_4_ = fStack_9a0;
            auVar31._12_4_ = fStack_99c;
            auVar86 = rcpps(auVar108,auVar31);
            fVar110 = auVar86._0_4_;
            fVar192 = auVar86._4_4_;
            fVar121 = auVar86._8_4_;
            fVar122 = auVar86._12_4_;
            fVar125 = (float)(-(uint)(1e-18 <= fVar125) &
                             (uint)(((float)DAT_01f46a60 - local_9a8 * fVar110) * fVar110 + fVar110)
                             );
            fVar135 = (float)(-(uint)(1e-18 <= fVar135) &
                             (uint)((DAT_01f46a60._4_4_ - fStack_9a4 * fVar192) * fVar192 + fVar192)
                             );
            fVar110 = (float)(-(uint)(1e-18 <= fVar111) &
                             (uint)((DAT_01f46a60._8_4_ - fStack_9a0 * fVar121) * fVar121 + fVar121)
                             );
            fVar111 = (float)(-(uint)(1e-18 <= fVar119) &
                             (uint)((DAT_01f46a60._12_4_ - fStack_99c * fVar122) * fVar122 + fVar122
                                   ));
            auVar68._0_4_ = fVar112 * (fVar57 + (float)uVar51 * local_9a8) * fVar125;
            auVar68._4_4_ = fVar112 * (fVar80 + (float)(uVar51 + 1) * fStack_9a4) * fVar135;
            auVar68._8_4_ = fVar112 * (auVar62._8_4_ + (float)(uVar51 + 1) * fStack_9a0) * fVar110;
            auVar68._12_4_ = fVar112 * (auVar62._12_4_ + (float)uVar51 * fStack_99c) * fVar111;
            local_ab8 = minps(auVar68,_DAT_01f46a60);
            auVar90._0_4_ = fVar120 * auVar108._0_4_ * fVar125;
            auVar90._4_4_ = fVar120 * auVar108._4_4_ * fVar135;
            auVar90._8_4_ = fVar120 * auVar108._8_4_ * fVar110;
            auVar90._12_4_ = fVar120 * auVar108._12_4_ * fVar111;
            local_aa8 = minps(auVar90,_DAT_01f46a60);
            uVar53 = (ulong)(uVar42 & 0xff);
            uVar39 = 0;
            if (uVar53 != 0) {
              for (; ((uVar42 & 0xff) >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
              }
            }
            local_cb8 = CONCAT44(uVar35,uVar35);
            uStack_cb0._0_4_ = (float)uVar35;
            uStack_cb0._4_4_ = (float)uVar35;
            auVar32 = *(undefined1 (*) [12])*local_bf0;
            uStack_c6c = (undefined4)((ulong)*(undefined8 *)(*local_bf0 + 8) >> 0x20);
            local_c38 = auVar52;
            while (uVar53 != 0) {
              local_968 = *(undefined4 *)(local_ab8 + uVar39 * 4);
              local_958._4_4_ = *(undefined4 *)(local_aa8 + uVar39 * 4);
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_a98 + uVar39 * 4);
              args.context = context->user;
              local_998 = *(undefined4 *)(local_a88 + uVar39 * 4);
              local_988._4_4_ = *(undefined4 *)(local_a78 + uVar39 * 4);
              local_978 = *(undefined4 *)(local_a68 + uVar39 * 4);
              uStack_994 = local_998;
              uStack_990 = local_998;
              uStack_98c = local_998;
              local_988._0_4_ = local_988._4_4_;
              local_988._8_4_ = local_988._4_4_;
              local_988._12_4_ = local_988._4_4_;
              uStack_974 = local_978;
              uStack_970 = local_978;
              uStack_96c = local_978;
              uStack_964 = local_968;
              uStack_960 = local_968;
              uStack_95c = local_968;
              local_958._0_4_ = local_958._4_4_;
              local_958._8_4_ = local_958._4_4_;
              local_958._12_4_ = local_958._4_4_;
              local_948 = local_cb8;
              uStack_940 = uStack_cb0;
              local_938 = CONCAT44(uVar33,uVar33);
              uStack_930 = CONCAT44(uVar33,uVar33);
              local_928 = (args.context)->instID[0];
              uStack_924 = local_928;
              uStack_920 = local_928;
              uStack_91c = local_928;
              local_918 = (args.context)->instPrimID[0];
              uStack_914 = local_918;
              uStack_910 = local_918;
              uStack_90c = local_918;
              local_c48._12_4_ = uStack_c6c;
              local_c48._0_12_ = auVar32;
              args.valid = (int *)local_c48;
              args.geometryUserPtr = ((Geometry *)auVar52)->userPtr;
              args.hit = (RTCHitN *)&local_998;
              args.N = 4;
              args.ray = (RTCRayN *)ray;
              if (((Geometry *)auVar52)->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*((Geometry *)auVar52)->occlusionFilterN)(&args);
                auVar52 = local_c38;
              }
              if (local_c48 == (undefined1  [16])0x0) {
                auVar91._8_4_ = 0xffffffff;
                auVar91._0_8_ = 0xffffffffffffffff;
                auVar91._12_4_ = 0xffffffff;
                auVar91 = auVar91 ^ _DAT_01f46b70;
              }
              else {
                p_Var17 = context->args->filter;
                if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                    (((((Geometry *)auVar52)->field_8).field_0x2 & 0x40) != 0)))) {
                  (*p_Var17)(&args);
                  auVar52 = local_c38;
                }
                auVar69._0_4_ = -(uint)(local_c48._0_4_ == 0);
                auVar69._4_4_ = -(uint)(local_c48._4_4_ == 0);
                auVar69._8_4_ = -(uint)(local_c48._8_4_ == 0);
                auVar69._12_4_ = -(uint)(local_c48._12_4_ == 0);
                auVar91 = auVar69 ^ _DAT_01f46b70;
                auVar86 = blendvps(_DAT_01f45a40,*(undefined1 (*) [16])(args.ray + 0x80),auVar69);
                *(undefined1 (*) [16])(args.ray + 0x80) = auVar86;
              }
              if ((_DAT_01f46b40 & auVar91) != (undefined1  [16])0x0) goto LAB_00746a83;
              *(float *)(ray + k * 4 + 0x80) = old_t;
              uVar53 = uVar53 ^ 1L << (uVar39 & 0x3f);
              uVar39 = 0;
              if (uVar53 != 0) {
                for (; (uVar53 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                }
              }
            }
            local_9f8 = *(float *)(ray + k * 4 + 0x10);
            local_a08 = *(float *)(ray + k * 4 + 0x20);
            fStack_c8c = *(float *)(ray + k * 4 + 0x40);
            fVar110 = *(float *)(ray + k * 4 + 0x50);
            fStack_cf4 = *(float *)(ray + k * 4 + 0x60);
            fStack_9f4 = local_9f8;
            fStack_9f0 = local_9f8;
            fStack_9ec = local_9f8;
            fStack_a04 = local_a08;
            fStack_a00 = local_a08;
            fStack_9fc = local_a08;
            fStack_a34 = fVar191 - local_a08;
            local_a28 = (local_8f8 - local_9f8) + (local_8e8 - local_9f8);
            fStack_a24 = (fStack_8f4 - local_9f8) + (fStack_8e4 - local_9f8);
            fStack_a20 = (fStack_8f0 - local_9f8) + (fStack_8e0 - local_9f8);
            fStack_a1c = (fStack_8ec - local_9f8) + (fStack_8dc - local_9f8);
            local_a18 = ((float)local_8d8 - local_a08) + (fVar182 - local_a08);
            fStack_a14 = (local_8d8._4_4_ - local_a08) + fStack_a34;
            fStack_a10 = (fStack_8d0 - local_a08) + (fStack_bb0 - local_a08);
            fStack_a0c = (fStack_8cc - local_a08) + (fStack_bac - local_a08);
            local_a38 = fVar182 - local_a08;
            fStack_a30 = fStack_bb0 - local_a08;
            fStack_a2c = fStack_bac - local_a08;
            local_a48 = local_8e8 - local_9f8;
            fStack_a44 = fStack_8e4 - local_9f8;
            fStack_a40 = fStack_8e0 - local_9f8;
            fStack_a3c = fStack_8dc - local_9f8;
            local_cb8._4_4_ = local_8d8._4_4_ - local_a08;
            local_cb8._0_4_ = (float)local_8d8 - local_a08;
            uStack_cb0._0_4_ = fStack_8d0 - local_a08;
            uStack_cb0._4_4_ = fStack_8cc - local_a08;
            local_9e8 = local_8f8 - local_9f8;
            fStack_9e4 = fStack_8f4 - local_9f8;
            fStack_9e0 = fStack_8f0 - local_9f8;
            fStack_9dc = fStack_8ec - local_9f8;
            goto LAB_00746149;
          }
LAB_00746a83:
          *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
          goto LAB_00746a98;
        }
LAB_00746149:
        fVar190 = fVar190 - fStack_9fc;
        fVar179 = fStack_830 - fStack_9fc;
        fVar181 = (float)uStack_c10 - fStack_9fc;
        fVar187 = fStack_840 - fStack_9fc;
        fVar183 = fVar183 - fStack_9ec;
        fVar163 = fStack_834 - fStack_9ec;
        fVar165 = local_c18._4_4_ - fStack_9ec;
        fVar166 = fStack_844 - fStack_9ec;
        fVar182 = *(float *)(ray + k * 4);
        old_t = fVar81 - fVar182;
        fStack_c24 = local_838 - fVar182;
        fStack_c20 = (float)local_c18 - fVar182;
        fStack_c1c = local_848 - fVar182;
        fVar171 = (float)local_828 - fVar182;
        fVar172 = local_828._4_4_ - fVar182;
        fVar176 = fStack_820 - fVar182;
        fVar177 = fStack_81c - fVar182;
        fVar191 = local_818 - fVar182;
        fVar57 = fStack_814 - fVar182;
        fVar111 = fStack_810 - fVar182;
        fVar182 = fStack_80c - fVar182;
        fVar119 = fVar191 - old_t;
        fVar112 = fVar57 - fStack_c24;
        fVar120 = fVar111 - fStack_c20;
        fVar192 = fVar182 - fStack_c1c;
        fVar158 = local_a48 - fVar183;
        fVar159 = fStack_a44 - fVar163;
        fVar160 = fStack_a40 - fVar165;
        fVar162 = fStack_a3c - fVar166;
        fVar134 = local_a38 - fVar190;
        fVar144 = fStack_a34 - fVar179;
        fStack_bb0 = fStack_a30 - fVar181;
        fStack_bac = fStack_a2c - fVar187;
        fVar125 = local_9e8 - local_a48;
        fVar81 = fStack_9e4 - fStack_a44;
        fVar135 = fStack_9e0 - fStack_a40;
        fVar80 = fStack_9dc - fStack_a3c;
        fVar189 = (float)local_cb8 - local_a38;
        fVar193 = local_cb8._4_4_ - fStack_a34;
        fVar194 = (float)uStack_cb0 - fStack_a30;
        fVar195 = uStack_cb0._4_4_ - fStack_a2c;
        fVar121 = old_t - fVar171;
        fVar122 = fStack_c24 - fVar172;
        fVar123 = fStack_c20 - fVar176;
        fVar133 = fStack_c1c - fVar177;
        fVar178 = (fVar158 * (local_a38 + fVar190) - (local_a48 + fVar183) * fVar134) * fStack_c8c +
                  ((fVar191 + old_t) * fVar134 - (local_a38 + fVar190) * fVar119) * fVar110 +
                  (fVar119 * (local_a48 + fVar183) - (fVar191 + old_t) * fVar158) * fStack_cf4;
        fVar180 = (fVar159 * (fStack_a34 + fVar179) - (fStack_a44 + fVar163) * fVar144) * fStack_c8c
                  + ((fVar57 + fStack_c24) * fVar144 - (fStack_a34 + fVar179) * fVar112) * fVar110 +
                    (fVar112 * (fStack_a44 + fVar163) - (fVar57 + fStack_c24) * fVar159) *
                    fStack_cf4;
        fVar184 = (fVar160 * (fStack_a30 + fVar181) - (fStack_a40 + fVar165) * fStack_bb0) *
                  fStack_c8c +
                  ((fVar111 + fStack_c20) * fStack_bb0 - (fStack_a30 + fVar181) * fVar120) * fVar110
                  + (fVar120 * (fStack_a40 + fVar165) - (fVar111 + fStack_c20) * fVar160) *
                    fStack_cf4;
        fVar188 = (fVar162 * (fStack_a2c + fVar187) - (fStack_a3c + fVar166) * fStack_bac) *
                  fStack_c8c +
                  ((fVar182 + fStack_c1c) * fStack_bac - (fStack_a2c + fVar187) * fVar192) * fVar110
                  + (fVar192 * (fStack_a3c + fVar166) - (fVar182 + fStack_c1c) * fVar162) *
                    fStack_cf4;
        fVar167 = fVar183 - local_9e8;
        fVar168 = fVar163 - fStack_9e4;
        fVar169 = fVar165 - fStack_9e0;
        fVar170 = fVar166 - fStack_9dc;
        fVar143 = fVar190 - (float)local_cb8;
        fVar149 = fVar179 - local_cb8._4_4_;
        fVar124 = fVar181 - (float)uStack_cb0;
        fVar150 = fVar187 - uStack_cb0._4_4_;
        local_c18 = CONCAT44(fVar149,fVar143);
        uStack_c10 = CONCAT44(fVar150,fVar124);
        auVar146._0_4_ =
             (fVar167 * ((float)local_cb8 + fVar190) - (local_9e8 + fVar183) * fVar143) * fStack_c8c
             + ((old_t + fVar171) * fVar143 - ((float)local_cb8 + fVar190) * fVar121) * fVar110 +
               (fVar121 * (local_9e8 + fVar183) - (old_t + fVar171) * fVar167) * fStack_cf4;
        auVar146._4_4_ =
             (fVar168 * (local_cb8._4_4_ + fVar179) - (fStack_9e4 + fVar163) * fVar149) * fStack_c8c
             + ((fStack_c24 + fVar172) * fVar149 - (local_cb8._4_4_ + fVar179) * fVar122) * fVar110
               + (fVar122 * (fStack_9e4 + fVar163) - (fStack_c24 + fVar172) * fVar168) * fStack_cf4;
        auVar146._8_4_ =
             (fVar169 * ((float)uStack_cb0 + fVar181) - (fStack_9e0 + fVar165) * fVar124) *
             fStack_c8c +
             ((fStack_c20 + fVar176) * fVar124 - ((float)uStack_cb0 + fVar181) * fVar123) * fVar110
             + (fVar123 * (fStack_9e0 + fVar165) - (fStack_c20 + fVar176) * fVar169) * fStack_cf4;
        auVar146._12_4_ =
             (fVar170 * (uStack_cb0._4_4_ + fVar187) - (fStack_9dc + fVar166) * fVar150) *
             fStack_c8c +
             ((fStack_c1c + fVar177) * fVar150 - (uStack_cb0._4_4_ + fVar187) * fVar133) * fVar110 +
             (fVar133 * (fStack_9dc + fVar166) - (fStack_c1c + fVar177) * fVar170) * fStack_cf4;
        fVar151 = fVar171 - fVar191;
        fVar152 = fVar172 - fVar57;
        fVar153 = fVar176 - fVar111;
        fVar154 = fVar177 - fVar182;
        auVar70._0_4_ =
             (fVar125 * local_a18 - local_a28 * fVar189) * fStack_c8c +
             ((fVar191 + fVar171) * fVar189 - local_a18 * fVar151) * fVar110 +
             (fVar151 * local_a28 - (fVar191 + fVar171) * fVar125) * fStack_cf4;
        auVar70._4_4_ =
             (fVar81 * fStack_a14 - fStack_a24 * fVar193) * fStack_c8c +
             ((fVar57 + fVar172) * fVar193 - fStack_a14 * fVar152) * fVar110 +
             (fVar152 * fStack_a24 - (fVar57 + fVar172) * fVar81) * fStack_cf4;
        auVar70._8_4_ =
             (fVar135 * fStack_a10 - fStack_a20 * fVar194) * fStack_c8c +
             ((fVar111 + fVar176) * fVar194 - fStack_a10 * fVar153) * fVar110 +
             (fVar153 * fStack_a20 - (fVar111 + fVar176) * fVar135) * fStack_cf4;
        auVar70._12_4_ =
             (fVar80 * fStack_a0c - fStack_a1c * fVar195) * fStack_c8c +
             ((fVar182 + fVar177) * fVar195 - fStack_a0c * fVar154) * fVar110 +
             (fVar154 * fStack_a1c - (fVar182 + fVar177) * fVar80) * fStack_cf4;
        local_c38._0_4_ = fVar178 + auVar146._0_4_ + auVar70._0_4_;
        local_c38._4_4_ = fVar180 + auVar146._4_4_ + auVar70._4_4_;
        fStack_c30 = fVar184 + auVar146._8_4_ + auVar70._8_4_;
        fStack_c2c = fVar188 + auVar146._12_4_ + auVar70._12_4_;
        auVar92._4_4_ = fVar180;
        auVar92._0_4_ = fVar178;
        auVar92._8_4_ = fVar184;
        auVar92._12_4_ = fVar188;
        auVar86 = minps(auVar92,auVar146);
        auVar86 = minps(auVar86,auVar70);
        auVar174._4_4_ = fVar180;
        auVar174._0_4_ = fVar178;
        auVar174._8_4_ = fVar184;
        auVar174._12_4_ = fVar188;
        auVar103 = maxps(auVar174,auVar146);
        auVar103 = maxps(auVar103,auVar70);
        fVar182 = ABS((float)local_c38._0_4_) * 1.1920929e-07;
        fVar191 = ABS((float)local_c38._4_4_) * 1.1920929e-07;
        fVar57 = ABS(fStack_c30) * 1.1920929e-07;
        fVar111 = ABS(fStack_c2c) * 1.1920929e-07;
        auVar175._4_4_ = -(uint)(auVar103._4_4_ <= fVar191);
        auVar175._0_4_ = -(uint)(auVar103._0_4_ <= fVar182);
        auVar175._8_4_ = -(uint)(auVar103._8_4_ <= fVar57);
        auVar175._12_4_ = -(uint)(auVar103._12_4_ <= fVar111);
        auVar93._4_4_ = -(uint)(-fVar191 <= auVar86._4_4_);
        auVar93._0_4_ = -(uint)(-fVar182 <= auVar86._0_4_);
        auVar93._8_4_ = -(uint)(-fVar57 <= auVar86._8_4_);
        auVar93._12_4_ = -(uint)(-fVar111 <= auVar86._12_4_);
        auVar175 = auVar175 | auVar93;
        iVar34 = movmskps(uVar41,auVar175);
        if (iVar34 != 0) {
          auVar131._0_4_ = fVar158 * fVar143 - fVar167 * fVar134;
          auVar131._4_4_ = fVar159 * fVar149 - fVar168 * fVar144;
          auVar131._8_4_ = fVar160 * fVar124 - fVar169 * fStack_bb0;
          auVar131._12_4_ = fVar162 * fVar150 - fVar170 * fStack_bac;
          auVar186._0_4_ = fVar167 * fVar189 - fVar125 * fVar143;
          auVar186._4_4_ = fVar168 * fVar193 - fVar81 * fVar149;
          auVar186._8_4_ = fVar169 * fVar194 - fVar135 * fVar124;
          auVar186._12_4_ = fVar170 * fVar195 - fVar80 * fVar150;
          auVar71._4_4_ = -(uint)(ABS(fVar168 * fVar144) < ABS(fVar81 * fVar149));
          auVar71._0_4_ = -(uint)(ABS(fVar167 * fVar134) < ABS(fVar125 * fVar143));
          auVar71._8_4_ = -(uint)(ABS(fVar169 * fStack_bb0) < ABS(fVar135 * fVar124));
          auVar71._12_4_ = -(uint)(ABS(fVar170 * fStack_bac) < ABS(fVar80 * fVar150));
          local_a88 = blendvps(auVar186,auVar131,auVar71);
          auVar142._0_4_ = fVar151 * fVar143 - fVar121 * fVar189;
          auVar142._4_4_ = fVar152 * fVar149 - fVar122 * fVar193;
          auVar142._8_4_ = fVar153 * fVar124 - fVar123 * fVar194;
          auVar142._12_4_ = fVar154 * fVar150 - fVar133 * fVar195;
          auVar72._4_4_ = -(uint)(ABS(fVar112 * fVar149) < ABS(fVar122 * fVar193));
          auVar72._0_4_ = -(uint)(ABS(fVar119 * fVar143) < ABS(fVar121 * fVar189));
          auVar72._8_4_ = -(uint)(ABS(fVar120 * fVar124) < ABS(fVar123 * fVar194));
          auVar72._12_4_ = -(uint)(ABS(fVar192 * fVar150) < ABS(fVar133 * fVar195));
          auVar29._4_4_ = fVar144 * fVar122 - fVar112 * fVar149;
          auVar29._0_4_ = fVar134 * fVar121 - fVar119 * fVar143;
          auVar29._8_4_ = fStack_bb0 * fVar123 - fVar120 * fVar124;
          auVar29._12_4_ = fStack_bac * fVar133 - fVar192 * fVar150;
          local_a78 = blendvps(auVar142,auVar29,auVar72);
          auVar156._0_4_ = fVar119 * fVar167 - fVar121 * fVar158;
          auVar156._4_4_ = fVar112 * fVar168 - fVar122 * fVar159;
          auVar156._8_4_ = fVar120 * fVar169 - fVar123 * fVar160;
          auVar156._12_4_ = fVar192 * fVar170 - fVar133 * fVar162;
          auVar118._0_4_ = fVar121 * fVar125 - fVar151 * fVar167;
          auVar118._4_4_ = fVar122 * fVar81 - fVar152 * fVar168;
          auVar118._8_4_ = fVar123 * fVar135 - fVar153 * fVar169;
          auVar118._12_4_ = fVar133 * fVar80 - fVar154 * fVar170;
          auVar73._4_4_ = -(uint)(ABS(fVar122 * fVar159) < ABS(fVar152 * fVar168));
          auVar73._0_4_ = -(uint)(ABS(fVar121 * fVar158) < ABS(fVar151 * fVar167));
          auVar73._8_4_ = -(uint)(ABS(fVar123 * fVar160) < ABS(fVar153 * fVar169));
          auVar73._12_4_ = -(uint)(ABS(fVar133 * fVar162) < ABS(fVar154 * fVar170));
          local_a68 = blendvps(auVar118,auVar156,auVar73);
          auVar94._0_4_ = fStack_cf4 * local_a68._0_4_;
          auVar94._4_4_ = fStack_cf4 * local_a68._4_4_;
          auVar94._8_4_ = fStack_cf4 * local_a68._8_4_;
          auVar94._12_4_ = fStack_cf4 * local_a68._12_4_;
          fVar182 = fStack_c8c * local_a88._0_4_ + fVar110 * local_a78._0_4_ + auVar94._0_4_;
          fVar125 = fStack_c8c * local_a88._4_4_ + fVar110 * local_a78._4_4_ + auVar94._4_4_;
          fVar81 = fStack_c8c * local_a88._8_4_ + fVar110 * local_a78._8_4_ + auVar94._8_4_;
          fVar191 = fStack_c8c * local_a88._12_4_ + fVar110 * local_a78._12_4_ + auVar94._12_4_;
          auVar132._0_4_ = fVar182 + fVar182;
          auVar132._4_4_ = fVar125 + fVar125;
          auVar132._8_4_ = fVar81 + fVar81;
          auVar132._12_4_ = fVar191 + fVar191;
          fVar190 = old_t * local_a88._0_4_ + fVar183 * local_a78._0_4_ + fVar190 * local_a68._0_4_;
          fVar191 = fStack_c24 * local_a88._4_4_ +
                    fVar163 * local_a78._4_4_ + fVar179 * local_a68._4_4_;
          fVar135 = fStack_c20 * local_a88._8_4_ +
                    fVar165 * local_a78._8_4_ + fVar181 * local_a68._8_4_;
          fVar110 = fStack_c1c * local_a88._12_4_ +
                    fVar166 * local_a78._12_4_ + fVar187 * local_a68._12_4_;
          auVar86 = rcpps(auVar94,auVar132);
          fVar182 = auVar86._0_4_;
          fVar125 = auVar86._4_4_;
          fVar81 = auVar86._8_4_;
          fVar183 = auVar86._12_4_;
          local_a98._0_4_ =
               ((1.0 - auVar132._0_4_ * fVar182) * fVar182 + fVar182) * (fVar190 + fVar190);
          local_a98._4_4_ =
               ((1.0 - auVar132._4_4_ * fVar125) * fVar125 + fVar125) * (fVar191 + fVar191);
          local_a98._8_4_ =
               ((1.0 - auVar132._8_4_ * fVar81) * fVar81 + fVar81) * (fVar135 + fVar135);
          local_a98._12_4_ =
               ((1.0 - auVar132._12_4_ * fVar183) * fVar183 + fVar183) * (fVar110 + fVar110);
          fVar182 = *(float *)(ray + k * 4 + 0x80);
          fVar125 = *(float *)(ray + k * 4 + 0x30);
          auVar95._0_4_ =
               -(uint)(local_a98._0_4_ <= fVar182 && fVar125 <= local_a98._0_4_) & auVar175._0_4_;
          auVar95._4_4_ =
               -(uint)(local_a98._4_4_ <= fVar182 && fVar125 <= local_a98._4_4_) & auVar175._4_4_;
          auVar95._8_4_ =
               -(uint)(local_a98._8_4_ <= fVar182 && fVar125 <= local_a98._8_4_) & auVar175._8_4_;
          auVar95._12_4_ =
               -(uint)(local_a98._12_4_ <= fVar182 && fVar125 <= local_a98._12_4_) & auVar175._12_4_
          ;
          iVar34 = movmskps(uVar41,auVar95);
          if (iVar34 != 0) {
            auVar96._0_4_ = auVar95._0_4_ & -(uint)(auVar132._0_4_ != 0.0);
            auVar96._4_4_ = auVar95._4_4_ & -(uint)(auVar132._4_4_ != 0.0);
            auVar96._8_4_ = auVar95._8_4_ & -(uint)(auVar132._8_4_ != 0.0);
            auVar96._12_4_ = auVar95._12_4_ & -(uint)(auVar132._12_4_ != 0.0);
            uVar35 = movmskps(iVar34,auVar96);
            if (uVar35 != 0) {
              auVar109._0_4_ = (float)local_c38._0_4_ - auVar146._0_4_;
              auVar109._4_4_ = (float)local_c38._4_4_ - auVar146._4_4_;
              auVar109._8_4_ = fStack_c30 - auVar146._8_4_;
              auVar109._12_4_ = fStack_c2c - auVar146._12_4_;
              auVar97._4_12_ = auVar96._4_12_;
              auVar97._0_4_ = (float)(int)(*(ushort *)(lVar38 + 8 + _old_t_1) - 1);
              auVar147._4_4_ = auVar96._4_4_;
              auVar147._0_4_ = auVar97._0_4_;
              auVar147._8_4_ = auVar96._8_4_;
              auVar147._12_4_ = auVar96._12_4_;
              auVar86 = rcpss(auVar147,auVar97);
              fVar125 = (2.0 - auVar97._0_4_ * auVar86._0_4_) * auVar86._0_4_;
              auVar148._4_12_ = auVar86._4_12_;
              auVar148._0_4_ = (float)(int)(*(ushort *)(lVar38 + 10 + _old_t_1) - 1);
              auVar157._4_4_ = auVar86._4_4_;
              auVar157._0_4_ = auVar148._0_4_;
              auVar157._8_4_ = auVar86._8_4_;
              auVar157._12_4_ = auVar86._12_4_;
              auVar86 = rcpss(auVar157,auVar148);
              fVar81 = (2.0 - auVar148._0_4_ * auVar86._0_4_) * auVar86._0_4_;
              pGVar15 = (context->scene->geometries).items[uVar33].ptr;
              if ((pGVar15->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar15->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_00746a83;
                auVar86 = rcpps(auVar109,_local_c38);
                fVar183 = auVar86._0_4_;
                fVar190 = auVar86._4_4_;
                fVar191 = auVar86._8_4_;
                fVar135 = auVar86._12_4_;
                fVar183 = (float)(-(uint)(1e-18 <= ABS((float)local_c38._0_4_)) &
                                 (uint)(((float)DAT_01f46a60 - (float)local_c38._0_4_ * fVar183) *
                                        fVar183 + fVar183));
                fVar190 = (float)(-(uint)(1e-18 <= ABS((float)local_c38._4_4_)) &
                                 (uint)((DAT_01f46a60._4_4_ - (float)local_c38._4_4_ * fVar190) *
                                        fVar190 + fVar190));
                fVar191 = (float)(-(uint)(1e-18 <= ABS(fStack_c30)) &
                                 (uint)((DAT_01f46a60._8_4_ - fStack_c30 * fVar191) * fVar191 +
                                       fVar191));
                fVar135 = (float)(-(uint)(1e-18 <= ABS(fStack_c2c)) &
                                 (uint)((DAT_01f46a60._12_4_ - fStack_c2c * fVar135) * fVar135 +
                                       fVar135));
                auVar74._0_4_ =
                     fVar125 * ((float)uVar51 * (float)local_c38._0_4_ +
                               ((float)local_c38._0_4_ - fVar178)) * fVar183;
                auVar74._4_4_ =
                     fVar125 * ((float)(uVar51 + 1) * (float)local_c38._4_4_ +
                               ((float)local_c38._4_4_ - fVar180)) * fVar190;
                auVar74._8_4_ =
                     fVar125 * ((float)(uVar51 + 1) * fStack_c30 + (fStack_c30 - fVar184)) * fVar191
                ;
                auVar74._12_4_ =
                     fVar125 * ((float)uVar51 * fStack_c2c + (fStack_c2c - fVar188)) * fVar135;
                local_ab8 = minps(auVar74,_DAT_01f46a60);
                auVar98._0_4_ =
                     fVar81 * ((float)(int)fVar161 * (float)local_c38._0_4_ + auVar109._0_4_) *
                     fVar183;
                auVar98._4_4_ =
                     fVar81 * ((float)(int)fVar161 * (float)local_c38._4_4_ + auVar109._4_4_) *
                     fVar190;
                auVar98._8_4_ =
                     fVar81 * ((float)((int)fVar161 + 1) * fStack_c30 + auVar109._8_4_) * fVar191;
                auVar98._12_4_ =
                     fVar81 * ((float)((int)fVar161 + 1) * fStack_c2c + auVar109._12_4_) * fVar135;
                local_aa8 = minps(auVar98,_DAT_01f46a60);
                uVar53 = (ulong)(uVar35 & 0xff);
                uVar39 = 0;
                if (uVar53 != 0) {
                  for (; ((uVar35 & 0xff) >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                  }
                }
                uVar41 = local_a58._0_4_;
                auVar86 = *local_bf0;
                _old_t_1 = (ulong)(uint)fVar182;
                uStack_c00 = 0;
                uStack_bfc = 0;
                local_a08 = fStack_9fc;
                fStack_a04 = fStack_9fc;
                fStack_a00 = fStack_9fc;
                local_9f8 = fStack_9ec;
                fStack_9f4 = fStack_9ec;
                fStack_9f0 = fStack_9ec;
                while (uVar53 != 0) {
                  local_968 = *(undefined4 *)(local_ab8 + uVar39 * 4);
                  uVar9 = *(undefined4 *)(local_aa8 + uVar39 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_a98 + uVar39 * 4);
                  args.context = context->user;
                  local_958._4_4_ = uVar9;
                  local_958._0_4_ = uVar9;
                  local_958._8_4_ = uVar9;
                  local_958._12_4_ = uVar9;
                  local_998 = *(undefined4 *)(local_a88 + uVar39 * 4);
                  uVar9 = *(undefined4 *)(local_a78 + uVar39 * 4);
                  local_978 = *(undefined4 *)(local_a68 + uVar39 * 4);
                  local_988._4_4_ = uVar9;
                  local_988._0_4_ = uVar9;
                  local_988._8_4_ = uVar9;
                  local_988._12_4_ = uVar9;
                  uStack_994 = local_998;
                  uStack_990 = local_998;
                  uStack_98c = local_998;
                  uStack_974 = local_978;
                  uStack_970 = local_978;
                  uStack_96c = local_978;
                  uStack_964 = local_968;
                  uStack_960 = local_968;
                  uStack_95c = local_968;
                  local_948 = CONCAT44(uVar41,uVar41);
                  uStack_940 = CONCAT44(uVar41,uVar41);
                  local_938 = CONCAT44(uVar33,uVar33);
                  uStack_930 = CONCAT44(uVar33,uVar33);
                  local_928 = (args.context)->instID[0];
                  uStack_924 = local_928;
                  uStack_920 = local_928;
                  uStack_91c = local_928;
                  local_918 = (args.context)->instPrimID[0];
                  uStack_914 = local_918;
                  uStack_910 = local_918;
                  uStack_90c = local_918;
                  args.valid = (int *)local_c48;
                  args.geometryUserPtr = pGVar15->userPtr;
                  args.hit = (RTCHitN *)&local_998;
                  args.N = 4;
                  local_c48 = auVar86;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar15->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar15->occlusionFilterN)(&args);
                    fVar182 = old_t_1;
                  }
                  if (local_c48 == (undefined1  [16])0x0) {
                    auVar99._8_4_ = 0xffffffff;
                    auVar99._0_8_ = 0xffffffffffffffff;
                    auVar99._12_4_ = 0xffffffff;
                    auVar99 = auVar99 ^ _DAT_01f46b70;
                  }
                  else {
                    p_Var17 = context->args->filter;
                    if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar15->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var17)(&args);
                      fVar182 = old_t_1;
                    }
                    auVar75._0_4_ = -(uint)(local_c48._0_4_ == 0);
                    auVar75._4_4_ = -(uint)(local_c48._4_4_ == 0);
                    auVar75._8_4_ = -(uint)(local_c48._8_4_ == 0);
                    auVar75._12_4_ = -(uint)(local_c48._12_4_ == 0);
                    auVar99 = auVar75 ^ _DAT_01f46b70;
                    auVar103 = blendvps(_DAT_01f45a40,*(undefined1 (*) [16])(args.ray + 0x80),
                                        auVar75);
                    *(undefined1 (*) [16])(args.ray + 0x80) = auVar103;
                  }
                  if ((_DAT_01f46b40 & auVar99) != (undefined1  [16])0x0) goto LAB_00746a83;
                  *(float *)(ray + k * 4 + 0x80) = fVar182;
                  uVar53 = uVar53 ^ 1L << (uVar39 & 0x3f);
                  uVar39 = 0;
                  if (uVar53 != 0) {
                    for (; (uVar53 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                    }
                  }
                }
              }
            }
          }
        }
        fVar182 = local_858;
        fVar135 = fStack_854;
        fVar110 = fStack_850;
        fVar161 = fStack_84c;
        fVar190 = local_898;
        fVar57 = fStack_894;
        fVar80 = fStack_890;
        fVar111 = fStack_88c;
        fVar191 = local_8a8;
        fVar119 = fStack_8a4;
        fVar112 = fStack_8a0;
        fVar120 = fStack_89c;
        fVar192 = local_8b8;
        fVar121 = fStack_8b4;
        fVar122 = fStack_8b0;
        fVar123 = fStack_8ac;
        fVar133 = fStack_8c0;
        fVar134 = fStack_8bc;
        fVar125 = local_868;
        fVar150 = fStack_864;
        fVar151 = fStack_860;
        fVar152 = fStack_85c;
        fVar81 = local_878;
        fVar153 = fStack_874;
        fVar154 = fStack_870;
        fVar158 = fStack_86c;
        fVar183 = local_888;
        fVar159 = fStack_884;
        fVar160 = fStack_880;
        fVar162 = fStack_87c;
      }
      auVar86 = local_9d8;
      auVar103 = local_9b8;
      fVar124 = local_9c8;
      fVar143 = fStack_9c4;
      fVar144 = fStack_9c0;
      fVar149 = fStack_9bc;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }